

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O2

void __thiscall QPainterPath::addEllipse(QPainterPath *this,QRectF *boundingRect)

{
  undefined1 *puVar1;
  ulong uVar2;
  QPainterPathPrivate *pQVar3;
  QRectF r;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  long in_FS_OFFSET;
  int point_count;
  qreal in_stack_fffffffffffffee8;
  QPointF local_110;
  int local_fc;
  QPointF local_f8;
  QPointF local_e8;
  QPointF local_d8;
  QPointF local_c8;
  QPointF local_b8;
  QPointF local_a8;
  QPointF local_98;
  QPointF local_88;
  QPointF local_78;
  QPointF local_68;
  QPointF local_58;
  QPointF local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = boundingRect->yp;
  uVar5 = boundingRect->w;
  uVar6 = boundingRect->h;
  r.w = (qreal)uVar6;
  r.yp = (qreal)uVar5;
  r.xp = (qreal)uVar4;
  r.h = in_stack_fffffffffffffee8;
  bVar7 = hasValidCoords(r);
  if ((bVar7) &&
     ((((boundingRect->w != 0.0 || (NAN(boundingRect->w))) || (boundingRect->h != 0.0)) ||
      (NAN(boundingRect->h))))) {
    ensureData(this);
    detach(this);
    uVar2 = (((this->d_ptr).d.ptr)->elements).d.size;
    memset(&local_f8,0,0xc0);
    local_fc = -0x55555556;
    local_110 = qt_curves_for_arc(boundingRect,0.0,-360.0,&local_f8,&local_fc);
    moveTo(this,&local_110);
    cubicTo(this,&local_f8,&local_e8,&local_d8);
    cubicTo(this,&local_c8,&local_b8,&local_a8);
    cubicTo(this,&local_98,&local_88,&local_78);
    cubicTo(this,&local_68,&local_58,&local_48);
    puVar1 = &((this->d_ptr).d.ptr)->field_0x84;
    *puVar1 = *puVar1 | 1;
    pQVar3 = (this->d_ptr).d.ptr;
    pQVar3->field_0x84 = pQVar3->field_0x84 & 0xef | (uVar2 < 2) << 4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainterPath::addEllipse(const QRectF &boundingRect)
{
    if (!hasValidCoords(boundingRect)) {
#ifndef QT_NO_DEBUG
        qWarning("QPainterPath::addEllipse: Adding point with invalid coordinates, ignoring call");
#endif
        return;
    }

    if (boundingRect.isNull())
        return;

    ensureData();
    detach();

    bool first = d_func()->elements.size() < 2;

    QPointF pts[12];
    int point_count;
    QPointF start = qt_curves_for_arc(boundingRect, 0, -360, pts, &point_count);

    moveTo(start);
    cubicTo(pts[0], pts[1], pts[2]);           // 0 -> 270
    cubicTo(pts[3], pts[4], pts[5]);           // 270 -> 180
    cubicTo(pts[6], pts[7], pts[8]);           // 180 -> 90
    cubicTo(pts[9], pts[10], pts[11]);         // 90 - >0
    d_func()->require_moveTo = true;

    d_func()->convex = first;
}